

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O3

Am_Object Am_Create_Screen(char *display_name)

{
  uint value;
  uint value_00;
  Am_Wrapper *value_01;
  Am_Object *pAVar1;
  Am_Value *this;
  Am_Ptr pvVar2;
  char *in_RSI;
  Am_Object_Advanced temp;
  Am_Object local_50;
  Am_Object local_48;
  Am_Value local_40;
  
  local_40.value.wrapper_value = (Am_Wrapper *)Am_Drawonable::Get_Root_Drawonable(in_RSI);
  if ((Am_Drawonable *)local_40.value.wrapper_value == (Am_Drawonable *)0x0) {
    display_name[0] = '\0';
    display_name[1] = '\0';
    display_name[2] = '\0';
    display_name[3] = '\0';
    display_name[4] = '\0';
    display_name[5] = '\0';
    display_name[6] = '\0';
    display_name[7] = '\0';
  }
  else {
    value = *(uint *)&(local_40.value.method_value)->ID_Ptr;
    value_00 = *(uint *)((long)&(local_40.value.method_value)->ID_Ptr + 4);
    Am_Object::Create(&local_48,(char *)&Am_Screen);
    value_01 = Am_Object::operator_cast_to_Am_Wrapper_(&Am_Screen);
    pAVar1 = Am_Object::Set(&local_48,0x7d5,value_01,1);
    local_40.type = Am_Am_Drawonable::Am_Am_Drawonable_ID;
    pAVar1 = Am_Object::Set(pAVar1,0x7d2,&local_40,1);
    pAVar1 = Am_Object::Set(pAVar1,0x66,value,0);
    pAVar1 = Am_Object::Set(pAVar1,0x67,value_00,0);
    Am_Object::Am_Object((Am_Object *)display_name,pAVar1);
    Am_Value::~Am_Value(&local_40);
    Am_Object::~Am_Object(&local_48);
    Am_Object::Am_Object((Am_Object *)&local_40,(Am_Object *)display_name);
    Am_Object::Am_Object(&local_50,(Am_Object *)display_name);
    this = Am_Object::Get(&local_50,0x7d2,0);
    pvVar2 = Am_Value::operator_cast_to_void_(this);
    Am_Object::Set((Am_Object *)display_name,0x87,*(int *)((long)pvVar2 + 0x54) != 1,0);
    Am_Object::~Am_Object(&local_50);
    Am_Object::~Am_Object((Am_Object *)&local_40);
  }
  return (Am_Object)(Am_Object_Data *)display_name;
}

Assistant:

Am_Object
Am_Create_Screen(const char *display_name)
{
  Am_Drawonable *new_root = Am_Drawonable::Get_Root_Drawonable(display_name);
  if (!new_root)
    return nullptr;
  int width, height;
  new_root->Get_Size(width, height);
  Am_Object new_screen =
      Am_Screen.Create(display_name)
          .Set(Am_SCREEN, Am_Screen, Am_OK_IF_NOT_THERE)
          .Set(Am_DRAWONABLE, (Am_Am_Drawonable)new_root, Am_OK_IF_NOT_THERE)
          .Set(Am_WIDTH, width)
          .Set(Am_HEIGHT, height);
  Am_Object_Advanced temp = (Am_Object_Advanced &)new_screen;
  //// NDY Create other slots that Am_Screen ought to have
  new_screen.Set(Am_IS_COLOR, screen_is_color(new_screen));
  return new_screen;
}